

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_converter_get_heap_size
                    (ma_data_converter_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ma_data_converter_heap_layout heapLayout;
  ma_data_converter_heap_layout local_20;
  
  if (pHeapSizeInBytes != (size_t *)0x0) {
    *pHeapSizeInBytes = 0;
    mVar1 = ma_data_converter_get_heap_layout(pConfig,&local_20);
    if (mVar1 == MA_SUCCESS) {
      *pHeapSizeInBytes = local_20.sizeInBytes;
      mVar1 = MA_SUCCESS;
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_data_converter_get_heap_size(const ma_data_converter_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_data_converter_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_data_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}